

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

string * amrex::UniqueString_abi_cxx11_(void)

{
  string *in_RDI;
  double dVar1;
  stringstream tempstring;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream local_1a8 [16];
  long local_198;
  undefined8 local_190 [2];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 0xb;
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  dVar1 = ParallelDescriptor::second();
  std::ostream::_M_insert<double>(dVar1);
  std::__cxx11::stringbuf::str();
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return in_RDI;
}

Assistant:

std::string
amrex::UniqueString()
{
  std::stringstream tempstring;
  tempstring << std::setprecision(11) << std::fixed << ParallelDescriptor::second();
  int tsl(tempstring.str().length());
  return(tempstring.str().substr(tsl/2, tsl));
}